

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiOutAlsa::initialize(MidiOutAlsa *this,string *clientName)

{
  int iVar1;
  undefined8 *puVar2;
  void *pvVar3;
  string *psVar4;
  snd_seq_t *seq;
  string local_78;
  string local_58;
  string local_38;
  
  iVar1 = snd_seq_open(&seq,"default",1);
  if (iVar1 < 0) {
    psVar4 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
    std::__cxx11::string::assign((char *)psVar4);
    std::__cxx11::string::string((string *)&local_38,(string *)psVar4);
    MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_38);
    psVar4 = &local_38;
  }
  else {
    snd_seq_set_client_name(seq,(clientName->_M_dataplus)._M_p);
    puVar2 = (undefined8 *)operator_new(0x58);
    *puVar2 = seq;
    puVar2[1] = 0xffffffffffffffff;
    *(undefined4 *)(puVar2 + 4) = 0x20;
    puVar2[3] = 0;
    puVar2[5] = 0;
    iVar1 = snd_midi_event_new(0x20,puVar2 + 3);
    if (iVar1 < 0) {
      operator_delete(puVar2,0x58);
      psVar4 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::assign((char *)psVar4);
      std::__cxx11::string::string((string *)&local_58,(string *)psVar4);
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_58);
      psVar4 = &local_58;
    }
    else {
      pvVar3 = malloc((ulong)*(uint *)(puVar2 + 4));
      puVar2[5] = pvVar3;
      if (pvVar3 != (void *)0x0) {
        snd_midi_event_init(puVar2[3]);
        (this->super_MidiOutApi).super_MidiApi.apiData_ = puVar2;
        return;
      }
      operator_delete(puVar2,0x58);
      psVar4 = &(this->super_MidiOutApi).super_MidiApi.errorString_;
      std::__cxx11::string::assign((char *)psVar4);
      std::__cxx11::string::string((string *)&local_78,(string *)psVar4);
      MidiApi::error((MidiApi *)this,MEMORY_ERROR,&local_78);
      psVar4 = &local_78;
    }
  }
  std::__cxx11::string::~string((string *)psVar4);
  return;
}

Assistant:

void MidiOutAlsa :: initialize( const std::string& clientName )
{
  // Set up the ALSA sequencer client.
  snd_seq_t *seq;
  int result1 = snd_seq_open( &seq, "default", SND_SEQ_OPEN_OUTPUT, SND_SEQ_NONBLOCK );
  if ( result1 < 0 ) {
    errorString_ = "MidiOutAlsa::initialize: error creating ALSA sequencer client object.";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }

  // Set client name.
  snd_seq_set_client_name( seq, clientName.c_str() );

  // Save our api-specific connection information.
  AlsaMidiData *data = (AlsaMidiData *) new AlsaMidiData;
  data->seq = seq;
  data->portNum = -1;
  data->vport = -1;
  data->bufferSize = 32;
  data->coder = 0;
  data->buffer = 0;
  int result = snd_midi_event_new( data->bufferSize, &data->coder );
  if ( result < 0 ) {
    delete data;
    errorString_ = "MidiOutAlsa::initialize: error initializing MIDI event parser!\n\n";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }
  data->buffer = (unsigned char *) malloc( data->bufferSize );
  if ( data->buffer == NULL ) {
    delete data;
    errorString_ = "MidiOutAlsa::initialize: error allocating buffer memory!\n\n";
    error( RtMidiError::MEMORY_ERROR, errorString_ );
    return;
  }
  snd_midi_event_init( data->coder );
  apiData_ = (void *) data;
}